

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

void dumpRnglistsSection(raw_ostream *OS,DWARFDataExtractor *rnglistData,
                        function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
                        LookupPooledAddress,DIDumpOptions DumpOpts)

{
  char *__n;
  ulong uVar1;
  ulong uVar2;
  raw_ostream *prVar3;
  uint64_t uVar4;
  size_t __n_00;
  Error *E;
  void *__buf;
  int iVar5;
  function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)> LookupPooledAddress_00
  ;
  undefined1 local_118 [8];
  DWARFDebugRnglistTable Rnglists;
  string local_68;
  ulong local_48;
  uint64_t Offset;
  undefined1 local_38 [8];
  Error Err;
  
  Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length =
       LookupPooledAddress.callable;
  LookupPooledAddress_00.callback = LookupPooledAddress.callback;
  local_48 = 0;
  do {
    uVar1 = local_48;
    if ((rnglistData->super_DataExtractor).Data.Length <= local_48) {
      return;
    }
    local_118 = (undefined1  [8])0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Version = 0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.AddrSize = '\0';
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.SegSize = '\0';
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.OffsetEntryCount =
         0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset =
         (uint64_t)anon_var_dwarf_31fe149;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data = (char *)0xf
    ;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Length =
         (long)"DW_TAG_generic_subrange" + 0x12;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.Data =
         (char *)0x5;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl._0_4_ = 0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._4_4_ = 0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_node_count =
         (long)"DIE address ranges are not contained in its parent\'s ranges:" + 0x35;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data = (char *)0x7;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left =
         Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
         super__Rb_tree_header._M_header._M_parent;
    llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_38,*rnglistData,
               (uint64_t *)local_118);
    uVar2 = (ulong)local_38 & 0xfffffffffffffffe;
    __n_00 = uVar2 != 0 | uVar2;
    local_38 = (undefined1  [8])__n_00;
    if (uVar2 == 0) {
      LookupPooledAddress_00.callable =
           Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length;
      llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::dump
                ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_118,OS,LookupPooledAddress_00,
                 DumpOpts);
LAB_00aee85f:
      iVar5 = 0;
    }
    else {
      prVar3 = llvm::WithColor::error();
      Offset = (ulong)local_38 | 1;
      local_38 = (undefined1  [8])0x0;
      llvm::toString_abi_cxx11_(&local_68,(llvm *)&Offset,E);
      prVar3 = (raw_ostream *)
               llvm::raw_ostream::write
                         (prVar3,(int)local_68._M_dataplus._M_p,(void *)local_68._M_string_length,
                          __n_00);
      __n = prVar3->OutBufCur;
      if (__n < prVar3->OutBufEnd) {
        prVar3->OutBufCur = __n + 1;
        *__n = '\n';
      }
      else {
        llvm::raw_ostream::write(prVar3,10,__buf,(size_t)__n);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((long *)(Offset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(Offset & 0xfffffffffffffffe) + 8))();
      }
      uVar4 = llvm::DWARFListTableHeader::length((DWARFListTableHeader *)local_118);
      if (uVar4 != 0) {
        local_48 = uVar1 + uVar4;
        goto LAB_00aee85f;
      }
      iVar5 = 3;
    }
    if ((long *)((ulong)local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_38 & 0xfffffffffffffffe) + 8))();
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                 *)&Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString
                    .Length);
    if (Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData._8_8_ != 0) {
      operator_delete((void *)Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.
                              HeaderData._8_8_,
                      (long)Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.
                            Offsets.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.
                      _8_8_);
    }
    if (iVar5 != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void dumpRnglistsSection(
    raw_ostream &OS, DWARFDataExtractor &rnglistData,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress,
    DIDumpOptions DumpOpts) {
  uint64_t Offset = 0;
  while (rnglistData.isValidOffset(Offset)) {
    llvm::DWARFDebugRnglistTable Rnglists;
    uint64_t TableOffset = Offset;
    if (Error Err = Rnglists.extract(rnglistData, &Offset)) {
      WithColor::error() << toString(std::move(Err)) << '\n';
      uint64_t Length = Rnglists.length();
      // Keep going after an error, if we can, assuming that the length field
      // could be read. If it couldn't, stop reading the section.
      if (Length == 0)
        break;
      Offset = TableOffset + Length;
    } else {
      Rnglists.dump(OS, LookupPooledAddress, DumpOpts);
    }
  }
}